

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O1

DArray<int> *
Kernel::PrecedenceOrdering::predLevelsFromOptsAndPrec
          (DArray<int> *__return_storage_ptr__,Problem *prb,Options *opt,
          DArray<int> *predicatePrecedences)

{
  LiteralComparisonMode LVar1;
  PredicateSineLevels PVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  uint uVar8;
  Entry *pEVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  uint local_34;
  
  uVar16 = (ulong)(*(long *)(DAT_00b7e1b0 + 0x88) - *(long *)(DAT_00b7e1b0 + 0x80)) >> 3;
  uVar15 = (uint)uVar16;
  uVar14 = uVar16 & 0xffffffff;
  ::Lib::DArray<int>::DArray(__return_storage_ptr__,uVar14);
  LVar1 = (opt->_literalComparisonMode).super_OptionValue<Shell::Options::LiteralComparisonMode>.
          actualValue;
  if (LVar1 < STANDARD) {
    if (1 < uVar15) {
      piVar11 = predicatePrecedences->_array;
      piVar3 = __return_storage_ptr__->_array;
      uVar12 = 1;
      do {
        piVar3[uVar12] = piVar11[uVar12] + 1;
        uVar12 = uVar12 + 1;
      } while (uVar14 != uVar12);
    }
  }
  else if ((LVar1 == STANDARD) &&
          (::Lib::DArray<int>::ensure(__return_storage_ptr__,uVar14), auVar6 = _DAT_00871040,
          auVar5 = _DAT_00871030, auVar4 = _DAT_00871020, uVar14 != 0)) {
    uVar12 = uVar14 + 0x3fffffffffffffff & 0x3fffffffffffffff;
    auVar18._8_4_ = (int)uVar12;
    auVar18._0_8_ = uVar12;
    auVar18._12_4_ = (int)(uVar12 >> 0x20);
    piVar11 = __return_storage_ptr__->_array + (uVar14 - 1);
    lVar13 = 0;
    auVar18 = auVar18 ^ _DAT_00871040;
    do {
      auVar20._8_4_ = (int)lVar13;
      auVar20._0_8_ = lVar13;
      auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar21 = (auVar20 | auVar5) ^ auVar6;
      iVar19 = auVar18._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar19 && auVar18._0_4_ < auVar21._0_4_ ||
                  iVar19 < auVar21._4_4_) & 1)) {
        *piVar11 = 1;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        piVar11[-1] = 1;
      }
      auVar20 = (auVar20 | auVar4) ^ auVar6;
      iVar22 = auVar20._4_4_;
      if (iVar22 <= iVar19 && (iVar22 != iVar19 || auVar20._0_4_ <= auVar18._0_4_)) {
        piVar11[-2] = 1;
        piVar11[-3] = 1;
      }
      lVar13 = lVar13 + 4;
      piVar11 = piVar11 + -4;
    } while ((uVar12 - ((uint)(uVar14 + 0x3fffffffffffffff) & 3)) + 4 != lVar13);
  }
  *__return_storage_ptr__->_array = 0;
  bVar7 = DAT_00b7e1c8;
  if (DAT_00b7e1d0 != (DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0)
  {
    uVar17 = (uint)DAT_00b7e1c8;
    PVar2 = (opt->_sineToPredLevels).super_OptionValue<Shell::Options::PredicateSineLevels>.
            actualValue;
    local_34 = 1;
    if (1 < uVar15) {
      do {
        pEVar9 = ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                 findEntry(DAT_00b7e1d0,&local_34);
        uVar10 = uVar17;
        if (pEVar9 != (Entry *)0x0) {
          uVar10 = pEVar9->_val;
        }
        uVar8 = bVar7 - uVar10;
        if (PVar2 != ON) {
          uVar8 = uVar10;
        }
        __return_storage_ptr__->_array[local_34] = uVar8 + 1;
        local_34 = local_34 + 1;
      } while (local_34 < uVar15);
    }
  }
  if (1 < uVar15) {
    lVar13 = *(long *)(DAT_00b7e1b0 + 0x80);
    piVar11 = __return_storage_ptr__->_array;
    uVar14 = 1;
    do {
      uVar17 = *(uint *)(*(long *)(lVar13 + uVar14 * 8) + 0x40);
      iVar19 = -1;
      if (((uVar17 & 0x20) != 0) || (iVar19 = uVar15 + 2, (uVar17 & 0x40) != 0)) {
        piVar11[uVar14] = iVar19;
      }
      uVar14 = uVar14 + 1;
    } while ((uVar16 & 0xffffffff) != uVar14);
  }
  return __return_storage_ptr__;
}

Assistant:

DArray<int> PrecedenceOrdering::predLevelsFromOptsAndPrec(Problem& prb, const Options& opt, const DArray<int>& predicatePrecedences) {
  unsigned nPredicates = env.signature->predicates();

  DArray<int> predicateLevels(nPredicates);

  switch(opt.literalComparisonMode()) {
  case Shell::Options::LiteralComparisonMode::STANDARD:
    predicateLevels.init(nPredicates, PredLevels::MIN_USER_DEF);
    break;
  case Shell::Options::LiteralComparisonMode::PREDICATE:
  case Shell::Options::LiteralComparisonMode::REVERSE:
    for(unsigned i=1;i<nPredicates;i++) {
      predicateLevels[i] = predicatePrecedences[i] + PredLevels::MIN_USER_DEF;
    }
    break;
  }
  //equality is on the lowest level
  predicateLevels[0] = PredLevels::EQ;

  if (env.predicateSineLevels) {
    // predicateSineLevels start from zero
    unsigned bound = env.maxSineLevel; // this is at least as large as the maximal value of a predicateSineLevel
    bool reverse = (opt.sineToPredLevels() == Options::PredicateSineLevels::ON); // the ON, i.e. reasonable, version wants low sine levels mapping to high predicateLevels

    for(unsigned i=1;i<nPredicates;i++) { // starting from 1, keeping predicateLevels[0]=0;
      unsigned level;
      if (!env.predicateSineLevels->find(i,level)) {
        level = bound;
      }
      predicateLevels[i] = (reverse ? (bound - level) : level) + PredLevels::MIN_USER_DEF;
      // cout << "setting predicate level of " << env.signature->predicateName(i) << " to " << predicateLevels[i] << endl;
    }
  }

  for(unsigned i=1;i<nPredicates;i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    //consequence-finding name predicates have the lowest level
    if(predSym->label()) {
      predicateLevels[i]=-1;
    }
    else if(predSym->equalityProxy()) {
      //equality proxy predicates have the highest level (lower than colored predicates)
      predicateLevels[i] = nPredicates + PredLevels::MIN_USER_DEF+ 1;
    }
  }

  checkLevelAssumptions(predicateLevels);
  return predicateLevels;
}